

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jitallocator.cpp
# Opt level: O0

Error __thiscall asmjit::_abi_1_10::JitAllocator::release(JitAllocator *this,void *rxPtr)

{
  ushort uVar1;
  ushort uVar2;
  uchar *puVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  uint32_t uVar7;
  JitAllocatorBlock *this_00;
  JitAllocatorPool *pJVar8;
  uint8_t *puVar9;
  size_t sVar10;
  ProtectJitReadWriteScope *in_RSI;
  JitAllocatorBlock *in_RDI;
  ProtectJitReadWriteScope scope;
  size_t spanSize;
  uint8_t *spanPtr;
  uint32_t areaSize;
  uint32_t areaEnd;
  uint32_t areaIndex;
  size_t offset;
  JitAllocatorPool *pool;
  JitAllocatorBlock *block;
  LockGuard guard;
  JitAllocatorPrivateImpl *impl;
  Lock *in_stack_ffffffffffffff68;
  Compare<(asmjit::_abi_1_10::Support::SortOrder)0> *in_stack_ffffffffffffff70;
  JitAllocatorBlock *in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffffa4;
  undefined1 value;
  undefined4 in_stack_ffffffffffffffa8;
  Error local_4;
  
  value = (undefined1)((uint)in_stack_ffffffffffffffa4 >> 0x18);
  if ((uchar *)(in_RDI->super_ZoneTreeNodeT<asmjit::_abi_1_10::JitAllocatorBlock>).
               super_ZoneTreeNode._rbNodeData[0] == JitAllocatorImpl_none) {
    local_4 = DebugUtils::errored(5);
  }
  else if (in_RSI == (ProtectJitReadWriteScope *)0x0) {
    local_4 = DebugUtils::errored(2);
  }
  else {
    puVar3 = (uchar *)(in_RDI->super_ZoneTreeNodeT<asmjit::_abi_1_10::JitAllocatorBlock>).
                      super_ZoneTreeNode._rbNodeData[0];
    LockGuard::LockGuard((LockGuard *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    this_00 = ZoneTree<asmjit::_abi_1_10::JitAllocatorBlock>::
              get<unsigned_char*,asmjit::_abi_1_10::Support::Compare<(asmjit::_abi_1_10::Support::SortOrder)0>>
                        ((ZoneTree<asmjit::_abi_1_10::JitAllocatorBlock> *)in_stack_ffffffffffffff80
                         ,(uchar **)in_RDI,in_stack_ffffffffffffff70);
    if (this_00 == (JitAllocatorBlock *)0x0) {
      local_4 = DebugUtils::errored(3);
    }
    else {
      pJVar8 = JitAllocatorBlock::pool(this_00);
      puVar9 = JitAllocatorBlock::rxPtr(this_00);
      iVar5 = (int)((ulong)((long)in_RSI - (long)puVar9) >> (pJVar8->granularityLog2 & 0x3f));
      sVar10 = Support::bitVectorIndexOf<unsigned_long>
                         ((unsigned_long *)((long)in_RSI - (long)puVar9),
                          CONCAT44(iVar5,in_stack_ffffffffffffffa8),(bool)value);
      iVar6 = ((int)sVar10 + 1) - iVar5;
      *(long *)(puVar3 + 0x40) = *(long *)(puVar3 + 0x40) + -1;
      JitAllocatorBlock::markReleasedArea
                (in_stack_ffffffffffffff80,(uint32_t)((ulong)in_RDI >> 0x20),(uint32_t)in_RDI);
      bVar4 = Support::
              test<asmjit::_abi_1_10::JitAllocatorOptions,asmjit::_abi_1_10::JitAllocatorOptions>
                        ((JitAllocatorOptions)((ulong)in_RSI >> 0x20),(JitAllocatorOptions)in_RSI);
      if (bVar4) {
        puVar9 = JitAllocatorBlock::rwPtr(this_00);
        uVar1 = pJVar8->granularity;
        uVar2 = pJVar8->granularity;
        VirtMem::ProtectJitReadWriteScope::ProtectJitReadWriteScope
                  (in_RSI,in_stack_ffffffffffffff68,0x13511e);
        JitAllocatorImpl_fillPattern
                  (puVar9 + iVar5 * (uint)uVar1,*(uint32_t *)(puVar3 + 0xc),
                   (ulong)(iVar6 * (uint)uVar2));
        VirtMem::ProtectJitReadWriteScope::~ProtectJitReadWriteScope(in_RSI);
      }
      uVar7 = JitAllocatorBlock::areaUsed(this_00);
      if (uVar7 == 0) {
        if ((pJVar8->emptyBlockCount != '\0') ||
           (bVar4 = Support::
                    test<asmjit::_abi_1_10::JitAllocatorOptions,asmjit::_abi_1_10::JitAllocatorOptions>
                              ((JitAllocatorOptions)((ulong)in_RSI >> 0x20),
                               (JitAllocatorOptions)in_RSI), bVar4)) {
          JitAllocatorImpl_removeBlock((JitAllocatorPrivateImpl *)in_stack_ffffffffffffff80,in_RDI);
          JitAllocatorImpl_deleteBlock((JitAllocatorPrivateImpl *)in_stack_ffffffffffffff80,in_RDI);
        }
        else {
          pJVar8->emptyBlockCount = pJVar8->emptyBlockCount + '\x01';
        }
      }
      local_4 = 0;
    }
    LockGuard::~LockGuard((LockGuard *)0x1351bd);
  }
  return local_4;
}

Assistant:

Error JitAllocator::release(void* rxPtr) noexcept {
  if (ASMJIT_UNLIKELY(_impl == &JitAllocatorImpl_none))
    return DebugUtils::errored(kErrorNotInitialized);

  if (ASMJIT_UNLIKELY(!rxPtr))
    return DebugUtils::errored(kErrorInvalidArgument);

  JitAllocatorPrivateImpl* impl = static_cast<JitAllocatorPrivateImpl*>(_impl);
  LockGuard guard(impl->lock);

  JitAllocatorBlock* block = impl->tree.get(static_cast<uint8_t*>(rxPtr));
  if (ASMJIT_UNLIKELY(!block))
    return DebugUtils::errored(kErrorInvalidState);

  // Offset relative to the start of the block.
  JitAllocatorPool* pool = block->pool();
  size_t offset = (size_t)((uint8_t*)rxPtr - block->rxPtr());

  // The first bit representing the allocated area and its size.
  uint32_t areaIndex = uint32_t(offset >> pool->granularityLog2);
  uint32_t areaEnd = uint32_t(Support::bitVectorIndexOf(block->_stopBitVector, areaIndex, true)) + 1;
  uint32_t areaSize = areaEnd - areaIndex;

  impl->allocationCount--;
  block->markReleasedArea(areaIndex, areaEnd);

  // Fill the released memory if the secure mode is enabled.
  if (Support::test(impl->options, JitAllocatorOptions::kFillUnusedMemory)) {
    uint8_t* spanPtr = block->rwPtr() + areaIndex * pool->granularity;
    size_t spanSize = areaSize * pool->granularity;

    VirtMem::ProtectJitReadWriteScope scope(spanPtr, spanSize);
    JitAllocatorImpl_fillPattern(spanPtr, impl->fillPattern, spanSize);
  }

  // Release the whole block if it became empty.
  if (block->areaUsed() == 0) {
    if (pool->emptyBlockCount || Support::test(impl->options, JitAllocatorOptions::kImmediateRelease)) {
      JitAllocatorImpl_removeBlock(impl, block);
      JitAllocatorImpl_deleteBlock(impl, block);
    }
    else {
      pool->emptyBlockCount++;
    }
  }

  return kErrorOk;
}